

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printCsvResult(Statement *query,ostream *stream,bool isFirstRow,bool clip)

{
  int32_t iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  double dVar4;
  Column local_b0;
  double local_98;
  double local_90;
  Column local_88;
  Column local_70;
  Column local_58;
  Column local_40;
  
  SQLite::Statement::getColumn(&local_b0,query,0);
  __s = SQLite::Column::getText(&local_b0,"");
  if (__s == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,",",1);
  SQLite::Statement::getColumn(&local_88,query,1);
  dVar4 = SQLite::Column::getDouble(&local_88);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  SQLite::Statement::getColumn(&local_40,query,2);
  dVar4 = SQLite::Column::getDouble(&local_40);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  SQLite::Statement::getColumn(&local_58,query,3);
  dVar4 = SQLite::Column::getDouble(&local_58);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  SQLite::Statement::getColumn(&local_70,query,4);
  dVar4 = SQLite::Column::getDouble(&local_70);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  if (local_70.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (clip) {
    SQLite::Statement::getColumn(&local_b0,query,5);
    local_90 = SQLite::Column::getDouble(&local_b0);
    SQLite::Statement::getColumn(&local_88,query,1);
    local_98 = SQLite::Column::getDouble(&local_88);
    if (local_88.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_90 <= local_98) {
      SQLite::Statement::getColumn(&local_b0,query,5);
      iVar1 = SQLite::Column::getInt(&local_b0);
      if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (iVar1 != 0) goto LAB_001164ae;
      std::__ostream_insert<char,std::char_traits<char>>(stream,"NaN,",4);
    }
    else {
      SQLite::Statement::getColumn(&local_b0,query,1);
      dVar4 = SQLite::Column::getDouble(&local_b0);
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
LAB_00116514:
    SQLite::Statement::getColumn(&local_b0,query,6);
    local_90 = SQLite::Column::getDouble(&local_b0);
    SQLite::Statement::getColumn(&local_88,query,3);
    local_98 = SQLite::Column::getDouble(&local_88);
    if (local_88.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_98 < local_90) {
      SQLite::Statement::getColumn(&local_b0,query,3);
      dVar4 = SQLite::Column::getDouble(&local_b0);
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      goto LAB_0011665b;
    }
    SQLite::Statement::getColumn(&local_b0,query,6);
    iVar1 = SQLite::Column::getInt(&local_b0);
    if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"NaN",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
      std::ostream::put((char)stream);
      std::ostream::flush();
      return;
    }
  }
  else {
LAB_001164ae:
    SQLite::Statement::getColumn(&local_b0,query,5);
    dVar4 = SQLite::Column::getDouble(&local_b0);
    poVar3 = std::ostream::_M_insert<double>(dVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (clip) goto LAB_00116514;
  }
  SQLite::Statement::getColumn(&local_b0,query,6);
  dVar4 = SQLite::Column::getDouble(&local_b0);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
LAB_0011665b:
  if (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void printCsvResult(SQLite::Statement& query, std::ostream& stream, bool isFirstRow, bool clip)
{
    stream << query.getColumn(0).getText()   << ","
           << query.getColumn(1).getDouble() << ","
           << query.getColumn(2).getDouble() << ","
           << query.getColumn(3).getDouble() << ","
           << query.getColumn(4).getDouble() << ",";

    if (clip && query.getColumn(5).getDouble() > query.getColumn(1).getDouble())
    {
        stream << query.getColumn(1).getDouble() << ",";
    }
    else if (clip && query.getColumn(5).getInt() == 0)
    {
        stream << "NaN,";
    }
    else
    {
        stream << query.getColumn(5).getDouble() << ",";
    }

    if (clip && query.getColumn(6).getDouble() > query.getColumn(3).getDouble())
    {
        stream << query.getColumn(3).getDouble() << std::endl;
    }
    else if (clip && query.getColumn(6).getInt() == 0)
    {
        stream << "NaN" << std::endl;
    }
    else
    {
        stream << query.getColumn(6).getDouble() << std::endl;
    }
}